

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtablewidget.cpp
# Opt level: O0

void __thiscall
QTableWidget::scrollToItem(QTableWidget *this,QTableWidgetItem *item,ScrollHint hint)

{
  QTableModel *__s;
  long in_RSI;
  long in_FS_OFFSET;
  QTableWidgetPrivate *d;
  QModelIndex index;
  ScrollHint in_stack_0000009c;
  QModelIndex *in_stack_000000a0;
  QTableView *in_stack_000000a8;
  undefined1 *local_20;
  undefined1 *local_18;
  QTableWidgetItem *local_10;
  Data *local_8;
  
  local_8 = *(Data **)(in_FS_OFFSET + 0x28);
  d_func((QTableWidget *)0x8dc252);
  if (in_RSI != 0) {
    local_20 = &DAT_aaaaaaaaaaaaaaaa;
    local_18 = &DAT_aaaaaaaaaaaaaaaa;
    local_10 = (QTableWidgetItem *)&DAT_aaaaaaaaaaaaaaaa;
    __s = QTableWidgetPrivate::tableModel((QTableWidgetPrivate *)0x8dc28f);
    QTableModel::index((QTableModel *)&local_20,(char *)__s,(int)in_RSI);
    QTableView::scrollTo(in_stack_000000a8,in_stack_000000a0,in_stack_0000009c);
  }
  if (*(Data **)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTableWidget::scrollToItem(const QTableWidgetItem *item, QAbstractItemView::ScrollHint hint)
{
    Q_D(QTableWidget);
    if (!item)
        return;
    QModelIndex index = d->tableModel()->index(const_cast<QTableWidgetItem*>(item));
    Q_ASSERT(index.isValid());
    QTableView::scrollTo(index, hint);
}